

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * __thiscall
MakefileGenerator::valGlue
          (MakefileGenerator *this,ProStringList *varList,QString *before,QString *glue,
          QString *after)

{
  bool bVar1;
  const_iterator o;
  ProString *this_00;
  char *in_RSI;
  QStringBuilder<const_QString_&,_QString_&> *in_RDI;
  long in_FS_OFFSET;
  ConstIterator it;
  QString ret;
  ProString *in_stack_ffffffffffffff48;
  QStringBuilder<const_QString_&,_QString_&> *this_01;
  const_iterator local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QString::QString((QString *)0x18d181);
  local_28.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_28 = QList<ProString>::begin((QList<ProString> *)in_RDI);
  while( true ) {
    o = QList<ProString>::end((QList<ProString> *)in_RDI);
    bVar1 = QList<ProString>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    this_00 = QList<ProString>::const_iterator::operator*(&local_28);
    bVar1 = ProString::isEmpty(this_00);
    if (!bVar1) {
      bVar1 = QString::isEmpty((QString *)0x18d1f2);
      if (!bVar1) {
        QString::operator+=((QString *)in_RDI,&in_stack_ffffffffffffff48->m_string);
      }
      QList<ProString>::const_iterator::operator*(&local_28);
      ProString::toQString(in_stack_ffffffffffffff48);
      QString::operator+=((QString *)in_RDI,&in_stack_ffffffffffffff48->m_string);
      QString::~QString((QString *)0x18d23e);
    }
    QList<ProString>::const_iterator::operator++(&local_28);
  }
  bVar1 = QString::isEmpty((QString *)0x18d25f);
  if (bVar1) {
    QString::QString((QString *)this_01,in_RSI);
  }
  else {
    ::operator+((QString *)in_RDI,&in_stack_ffffffffffffff48->m_string);
    ::operator+(in_RDI,&in_stack_ffffffffffffff48->m_string);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> *)
               in_stack_ffffffffffffff48);
  }
  QString::~QString((QString *)0x18d2c4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valGlue(const ProStringList &varList, const QString &before, const QString &glue, const QString &after) const
{
    QString ret;
    for (ProStringList::ConstIterator it = varList.begin(); it != varList.end(); ++it) {
        if (!(*it).isEmpty()) {
            if (!ret.isEmpty())
                ret += glue;
            ret += (*it).toQString();
        }
    }
    return ret.isEmpty() ? QString("") : before + ret + after;
}